

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.cpp
# Opt level: O0

void deqp::gls::StateQueryUtil::queryAttributeState
               (ResultCollector *result,CallLogWrapper *gl,QueryType type,GLenum target,int index,
               QueriedState *state)

{
  bool bVar1;
  float *pfVar2;
  int *piVar3;
  uint *puVar4;
  QueriedState local_110;
  undefined1 local_e4 [8];
  StateQueryMemoryWriteGuard<unsigned_int> value_3;
  undefined1 local_ac [8];
  StateQueryMemoryWriteGuard<int> value_2;
  undefined1 local_74 [8];
  StateQueryMemoryWriteGuard<float> value_1;
  undefined1 local_3c [8];
  StateQueryMemoryWriteGuard<int> value;
  QueriedState *state_local;
  int index_local;
  GLenum target_local;
  QueryType type_local;
  CallLogWrapper *gl_local;
  ResultCollector *result_local;
  
  value._4_8_ = state;
  switch(type) {
  case QUERY_ATTRIBUTE_INTEGER:
    StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
              ((StateQueryMemoryWriteGuard<int> *)local_3c);
    piVar3 = StateQueryMemoryWriteGuard<int>::operator&((StateQueryMemoryWriteGuard<int> *)local_3c)
    ;
    glu::CallLogWrapper::glGetVertexAttribiv(gl,index,target,piVar3);
    bVar1 = checkError(result,gl,"glGetVertexAttribiv");
    if ((bVar1) &&
       (bVar1 = StateQueryMemoryWriteGuard<int>::verifyValidity
                          ((StateQueryMemoryWriteGuard<int> *)local_3c,result), bVar1)) {
      piVar3 = StateQueryMemoryWriteGuard::operator_cast_to_int_
                         ((StateQueryMemoryWriteGuard *)local_3c);
      QueriedState::QueriedState((QueriedState *)&value_1.m_value,*piVar3);
      memcpy((void *)value._4_8_,&value_1.m_value,0x28);
    }
    break;
  case QUERY_ATTRIBUTE_FLOAT:
    StateQueryMemoryWriteGuard<float>::StateQueryMemoryWriteGuard
              ((StateQueryMemoryWriteGuard<float> *)local_74);
    pfVar2 = StateQueryMemoryWriteGuard<float>::operator&
                       ((StateQueryMemoryWriteGuard<float> *)local_74);
    glu::CallLogWrapper::glGetVertexAttribfv(gl,index,target,pfVar2);
    bVar1 = checkError(result,gl,"glGetVertexAttribfv");
    if ((bVar1) &&
       (bVar1 = StateQueryMemoryWriteGuard<float>::verifyValidity
                          ((StateQueryMemoryWriteGuard<float> *)local_74,result), bVar1)) {
      pfVar2 = StateQueryMemoryWriteGuard::operator_cast_to_float_
                         ((StateQueryMemoryWriteGuard *)local_74);
      QueriedState::QueriedState((QueriedState *)&value_2.m_value,*pfVar2);
      memcpy((void *)value._4_8_,&value_2.m_value,0x28);
    }
    break;
  case QUERY_ATTRIBUTE_PURE_INTEGER:
    StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
              ((StateQueryMemoryWriteGuard<int> *)local_ac);
    piVar3 = StateQueryMemoryWriteGuard<int>::operator&((StateQueryMemoryWriteGuard<int> *)local_ac)
    ;
    glu::CallLogWrapper::glGetVertexAttribIiv(gl,index,target,piVar3);
    bVar1 = checkError(result,gl,"glGetVertexAttribIiv");
    if ((bVar1) &&
       (bVar1 = StateQueryMemoryWriteGuard<int>::verifyValidity
                          ((StateQueryMemoryWriteGuard<int> *)local_ac,result), bVar1)) {
      piVar3 = StateQueryMemoryWriteGuard::operator_cast_to_int_
                         ((StateQueryMemoryWriteGuard *)local_ac);
      QueriedState::QueriedState((QueriedState *)&value_3.m_value,*piVar3);
      memcpy((void *)value._4_8_,&value_3.m_value,0x28);
    }
    break;
  case QUERY_ATTRIBUTE_PURE_UNSIGNED_INTEGER:
    StateQueryMemoryWriteGuard<unsigned_int>::StateQueryMemoryWriteGuard
              ((StateQueryMemoryWriteGuard<unsigned_int> *)local_e4);
    puVar4 = StateQueryMemoryWriteGuard<unsigned_int>::operator&
                       ((StateQueryMemoryWriteGuard<unsigned_int> *)local_e4);
    glu::CallLogWrapper::glGetVertexAttribIuiv(gl,index,target,puVar4);
    bVar1 = checkError(result,gl,"glGetVertexAttribIuiv");
    if ((bVar1) &&
       (bVar1 = StateQueryMemoryWriteGuard<unsigned_int>::verifyValidity
                          ((StateQueryMemoryWriteGuard<unsigned_int> *)local_e4,result), bVar1)) {
      puVar4 = StateQueryMemoryWriteGuard::operator_cast_to_unsigned_int_
                         ((StateQueryMemoryWriteGuard *)local_e4);
      QueriedState::QueriedState(&local_110,*puVar4);
      memcpy((void *)value._4_8_,&local_110,0x28);
    }
  }
  return;
}

Assistant:

void queryAttributeState (tcu::ResultCollector& result, glu::CallLogWrapper& gl, QueryType type, glw::GLenum target, int index, QueriedState& state)
{
	switch (type)
	{
		case QUERY_ATTRIBUTE_INTEGER:
		{
			StateQueryMemoryWriteGuard<glw::GLint> value;
			gl.glGetVertexAttribiv(index, target, &value);

			if (!checkError(result, gl, "glGetVertexAttribiv"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}
		case QUERY_ATTRIBUTE_FLOAT:
		{
			StateQueryMemoryWriteGuard<glw::GLfloat> value;
			gl.glGetVertexAttribfv(index, target, &value);

			if (!checkError(result, gl, "glGetVertexAttribfv"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}
		case QUERY_ATTRIBUTE_PURE_INTEGER:
		{
			StateQueryMemoryWriteGuard<glw::GLint> value;
			gl.glGetVertexAttribIiv(index, target, &value);

			if (!checkError(result, gl, "glGetVertexAttribIiv"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}
		case QUERY_ATTRIBUTE_PURE_UNSIGNED_INTEGER:
		{
			StateQueryMemoryWriteGuard<glw::GLuint> value;
			gl.glGetVertexAttribIuiv(index, target, &value);

			if (!checkError(result, gl, "glGetVertexAttribIuiv"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}
		default:
			DE_ASSERT(false);
	}
}